

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O0

acmod_id_t * mk_boundary_phone(char *word,uint32 n_begin,lexicon_t *lex)

{
  uint32 uVar1;
  lex_entry_t *plVar2;
  acmod_id_t *p;
  lex_entry_t *e;
  uint32 n_p;
  lexicon_t *lex_local;
  uint32 n_begin_local;
  char *word_local;
  
  plVar2 = lexicon_lookup(lex,word);
  if (plVar2 == (lex_entry_t *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0x117,"Unable to lookup word \'%s\' in the dictionary\n",word);
    word_local = (char *)0x0;
  }
  else {
    uVar1 = plVar2->phone_cnt;
    word_local = (char *)__ckd_calloc__(1,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                        ,0x11d);
    if (uVar1 != 0) {
      if (n_begin == 1) {
        *(acmod_id_t *)word_local = *plVar2->ci_acmod_id;
      }
      else {
        *(acmod_id_t *)word_local = plVar2->ci_acmod_id[uVar1 - 1];
      }
    }
  }
  return (acmod_id_t *)word_local;
}

Assistant:

acmod_id_t *
mk_boundary_phone(char *word,
		  uint32 n_begin,
		  lexicon_t *lex)
{
  uint32 n_p;
  lex_entry_t *e;
  acmod_id_t *p;
  
  e = lexicon_lookup(lex, word);
  if (e == NULL) {
    E_WARN("Unable to lookup word '%s' in the dictionary\n", word);
    
    return NULL;
  }
  n_p = e->phone_cnt;
  
  p = ckd_calloc(1, sizeof(acmod_id_t));
  
  if (n_p != 0) {
    if (n_begin == 1)
      p[0] = e->ci_acmod_id[0];
    else
      p[0] = e->ci_acmod_id[n_p-1];
  }
  
  return p;
}